

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnMoneyCrate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,int amount)

{
  bool bVar1;
  __sv_type _Var2;
  code *local_d8;
  size_t local_b8;
  char *local_b0;
  string local_a8;
  __sv_type local_88;
  __sv_type local_78;
  undefined1 local_58 [8];
  string msg;
  logFuncType func;
  int amount_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x2a & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_58,&this->moneyCrateFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (!bVar1) {
    RenX::processTags((string *)local_58,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    local_78 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 0x14e8));
    string_printf_abi_cxx11_(&local_a8,"%d",(ulong)(uint)amount);
    local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
    RenX::replace_tag(local_58,local_78._M_len,local_78._M_str,local_88._M_len,local_88._M_str);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_d8 = (code *)msg.field_2._8_8_;
    }
    else {
      local_d8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_b8 = _Var2._M_len;
    local_b0 = _Var2._M_str;
    (*local_d8)(server,local_b8,local_b0);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnMoneyCrate(RenX::Server &server, const RenX::PlayerInfo &player, int amount)
{
	logFuncType func;
	if (RenX_LoggingPlugin::moneyCratePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->moneyCrateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, string_printf("%d", amount));
		(server.*func)(msg);
	}
}